

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ymfm_opn.cpp
# Opt level: O1

void __thiscall
ymfm::ssg_resampler<ymfm::ymfm_output<3>,_2,_true>::resample_n_1<4>
          (ssg_resampler<ymfm::ymfm_output<3>,_2,_true> *this,ymfm_output<3> *output,
          uint32_t numsamples)

{
  int32_t *piVar1;
  
  if (numsamples != 0) {
    piVar1 = output->data + 2;
    do {
      if ((this->m_sampindex & 3) == 0) {
        ssg_engine::clock(this->m_ssg);
        ssg_engine::output(this->m_ssg,&this->m_last);
      }
      *piVar1 = (((this->m_last).data[1] + (this->m_last).data[0] + (this->m_last).data[2]) * 2) / 3
      ;
      this->m_sampindex = this->m_sampindex + 1;
      piVar1 = piVar1 + 3;
      numsamples = numsamples - 1;
    } while (numsamples != 0);
  }
  return;
}

Assistant:

void ssg_resampler<OutputType, FirstOutput, MixTo1>::resample_n_1(OutputType *output, uint32_t numsamples)
{
	for (uint32_t samp = 0; samp < numsamples; samp++, output++)
	{
		if (m_sampindex % Multiplier == 0)
		{
			m_ssg.clock();
			m_ssg.output(m_last);
		}
		write_to_output(output, m_last.data[0], m_last.data[1], m_last.data[2]);
	}
}